

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testCaseEnded(StreamingReporterBase *this,TestCaseStats *param_1)

{
  bool bVar1;
  TestCaseStats *param_1_local;
  StreamingReporterBase *this_local;
  
  LazyStat<Catch::TestCaseInfo>::reset(&this->currentTestCaseInfo);
  bVar1 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::empty
                    (&this->m_sectionStack);
  if (!bVar1) {
    __assert_fail("m_sectionStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/contrib/catch/catch.hpp"
                  ,0x1c4b,
                  "virtual void Catch::StreamingReporterBase::testCaseEnded(const TestCaseStats &)")
    ;
  }
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& /* _testCaseStats */ ) {
            currentTestCaseInfo.reset();
            assert( m_sectionStack.empty() );
        }